

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ysf.cpp
# Opt level: O0

void __thiscall DSDcc::DSDYSF::processVD2Voice(DSDYSF *this,int mbeIndex,uchar dibit)

{
  uint bitIndex;
  uint bitIndex_00;
  bool bVar1;
  byte bVar2;
  ostream *this_00;
  ulong uVar3;
  byte in_DL;
  int in_ESI;
  long *in_RDI;
  int i;
  uint bit;
  uint mbeIndex_1;
  int nbOnes;
  uint lsbI;
  uint msbI;
  int local_28;
  
  if (in_ESI == 0) {
    in_RDI[0x821] = (long)&rW;
    in_RDI[0x822] = (long)&rX;
    in_RDI[0x823] = (long)&rY;
    in_RDI[0x824] = (long)&rZ;
    memset((void *)(*in_RDI + 0x701e0),0,9);
    memset(in_RDI + 0x7f,0,0x68);
    memset(in_RDI + 0x8c,0,0x48);
  }
  bitIndex = *(uint *)(m_vd2Interleave + (long)(in_ESI << 1) * 4);
  bitIndex_00 = *(uint *)(m_vd2Interleave + (long)(in_ESI * 2 + 1) * 4);
  bVar2 = PN_9_5::getBit((PN_9_5 *)(in_RDI + 0x7c8),bitIndex);
  *(byte *)((long)in_RDI + (ulong)bitIndex + 0x3f8) = (byte)((int)(uint)in_DL >> 1) & 1 ^ bVar2;
  bVar2 = PN_9_5::getBit((PN_9_5 *)(in_RDI + 0x7c8),bitIndex_00);
  *(byte *)((long)in_RDI + (ulong)bitIndex_00 + 0x3f8) = in_DL & 1 ^ bVar2;
  if (in_ESI == 0x33) {
    if (*(char *)((long)in_RDI + 0x45f) != '\0') {
      this_00 = std::operator<<((ostream *)&std::cerr,"DSDYSF::processVD2Voice: error bit 103");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    for (local_28 = 0; local_28 < 0x67; local_28 = local_28 + 1) {
      if (local_28 < 0x51) {
        if (local_28 % 3 == 2) {
          bVar1 = 1 < (uint)*(byte *)((long)in_RDI + (long)(local_28 + -2) + 0x3f8) +
                      (uint)*(byte *)((long)in_RDI + (long)(local_28 + -1) + 0x3f8) +
                      (uint)*(byte *)((long)in_RDI + (long)local_28 + 0x3f8);
          *(bool *)((long)in_RDI + (long)(local_28 / 3) + 0x460) = bVar1;
          uVar3 = (ulong)(*(uint *)(m_vd2DVSIInterleave + (long)(local_28 / 3) * 4) >> 3);
          *(char *)(*in_RDI + 0x701e0 + uVar3) =
               *(char *)(*in_RDI + 0x701e0 + uVar3) +
               (bVar1 << (7 - ((byte)*(uint *)(m_vd2DVSIInterleave + (long)(local_28 / 3) * 4) & 7)
                         & 0x1f));
        }
      }
      else if (local_28 < 0x67) {
        *(undefined1 *)((long)in_RDI + (long)(local_28 + -0x36) + 0x460) =
             *(undefined1 *)((long)in_RDI + (long)local_28 + 0x3f8);
        uVar3 = (ulong)(*(uint *)(m_vd2DVSIInterleave + (long)(local_28 + -0x36) * 4) >> 3);
        *(char *)(*in_RDI + 0x701e0 + uVar3) =
             *(char *)(*in_RDI + 0x701e0 + uVar3) +
             (*(char *)((long)in_RDI + (long)local_28 + 0x3f8) <<
             (7 - ((byte)*(uint *)(m_vd2DVSIInterleave + (long)(local_28 + -0x36) * 4) & 7) & 0x1f))
        ;
      }
    }
    DSDMBEDecoder::processData
              ((DSDMBEDecoder *)(*in_RDI + 0xf490),(char *)0x0,(char *)(in_RDI + 0x8c));
    *(undefined1 *)(*in_RDI + 0x701f2) = 1;
  }
  return;
}

Assistant:

void DSDYSF::processVD2Voice(int mbeIndex, unsigned char dibit)
{
    if (mbeIndex == 0) // init
    {
        w = rW;
        x = rX;
        y = rY;
        z = rZ;

        memset((void *) m_dsdDecoder->m_mbeDVFrame1, 0, 9); // initialize DVSI frame
        memset(m_vd2BitsRaw, 0, 104);
        memset(m_vd2MBEBits, 0, 72);
    }

    // de-interleave and de-whiten in one shot
    unsigned int msbI = m_vd2Interleave[2*mbeIndex];
    unsigned int lsbI = m_vd2Interleave[2*mbeIndex+1];
    m_vd2BitsRaw[msbI] = ((dibit>>1) & 1) ^ m_pn.getBit(msbI);
    m_vd2BitsRaw[lsbI] = (dibit & 1) ^ m_pn.getBit(lsbI);

    if (mbeIndex == 52 - 1) // final
    {
        int nbOnes;
        unsigned int mbeIndex;
        unsigned int bit;

        if (m_vd2BitsRaw[103] != 0) {
            std::cerr << "DSDYSF::processVD2Voice: error bit 103" << std::endl;
        }

        for (int i = 0; i < 103; i++)
        {
            if (i < 81)
            {
                if (i%3 == 2)
                {
                    nbOnes = m_vd2BitsRaw[i-2] + m_vd2BitsRaw[i-1] + m_vd2BitsRaw[i];
                    bit = nbOnes > 1 ? 1 : 0;
                    m_vd2MBEBits[i/3] = bit;
                    mbeIndex = m_vd2DVSIInterleave[i/3];
                    m_dsdDecoder->m_mbeDVFrame1[mbeIndex/8] += bit<<(7-(mbeIndex%8));
                }
            }
            else if (i < 103)
            {
                m_vd2MBEBits[i-81+27] = m_vd2BitsRaw[i];
                mbeIndex = m_vd2DVSIInterleave[i-81+27];
                m_dsdDecoder->m_mbeDVFrame1[mbeIndex/8] += (m_vd2BitsRaw[i])<<(7-(mbeIndex%8));
            }
        }

        m_dsdDecoder->m_mbeDecoder1.processData(0, (char *) m_vd2MBEBits);
        m_dsdDecoder->m_mbeDVReady1 = true; // Indicate that a DVSI frame is available
    }
}